

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O1

void __thiscall
spvtools::opt::RegisterLiveness::SimulateFusion
          (RegisterLiveness *this,Loop *l1,Loop *l2,RegionRegisterLiveness *sim_result)

{
  Op OVar1;
  IRContext *pIVar2;
  mapped_type pBVar3;
  __node_base _Var4;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __first;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __first_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __last;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __last_00;
  RegionRegisterLiveness *this_00;
  Loop *pLVar5;
  __node_base _Var6;
  uint32_t uVar7;
  int32_t iVar8;
  RegionRegisterLiveness *pRVar9;
  size_type sVar10;
  mapped_type *ppBVar11;
  ulong uVar12;
  __hashtable *__h;
  Instruction *insn_1;
  Instruction *pIVar13;
  Loop *in_R9;
  _Hash_node_base *p_Var14;
  __node_base _Var15;
  __hashtable *__h_2;
  anon_class_16_2_f9f0633a_for_predicate_ predicate;
  anon_class_16_2_f9f0633a_for_predicate_ predicate_00;
  LiveSet l1_latch_live_out;
  Range live_loop;
  __alloc_node_gen_t __alloc_node_gen;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_insn;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  _AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction_*,_false>_>_>
  local_168;
  Loop *local_160;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_158;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_120;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_100;
  RegionRegisterLiveness *local_e0;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  RegionRegisterLiveness::Clear(sim_result);
  pRVar9 = Get(this,l1->loop_header_);
  if (pRVar9 != sim_result) {
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)sim_result,
               (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)pRVar9);
  }
  pRVar9 = Get(this,l2->loop_header_);
  p_Var14 = (pRVar9->live_in_)._M_h._M_before_begin._M_nxt;
  local_120.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)sim_result;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)sim_result,p_Var14 + 1,&local_120);
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_160 = l2;
  Loop::GetExitBlocks(l2,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&local_68);
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var15._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      pRVar9 = Get(this,*(uint32_t *)&_Var15._M_nxt[1]._M_nxt);
      local_120.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)&sim_result->live_out_;
      for (p_Var14 = (pRVar9->live_in_)._M_h._M_before_begin._M_nxt;
          p_Var14 != (_Hash_node_base *)0x0; p_Var14 = p_Var14->_M_nxt) {
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&sim_result->live_out_,p_Var14 + 1,&local_120);
      }
      _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt;
    } while (_Var15._M_nxt != (_Hash_node_base *)0x0);
  }
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  p_Var14 = (sim_result->live_out_)._M_h._M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    do {
      pIVar13 = (Instruction *)p_Var14[1]._M_nxt;
      RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar13);
      uVar7 = 0;
      if (pIVar13->has_result_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
      }
      local_158._M_buckets = (__buckets_ptr)CONCAT44(local_158._M_buckets._4_4_,uVar7);
      local_120.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)&local_a0;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_a0,&local_158,&local_120);
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  p_Var14 = (sim_result->live_in_)._M_h._M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    do {
      pIVar13 = (Instruction *)p_Var14[1]._M_nxt;
      uVar7 = 0;
      if (pIVar13->has_result_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
      }
      local_120.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._0_4_ =
           uVar7;
      sVar10 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&local_a0,(key_type *)&local_120);
      if (sVar10 != 0) {
        RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar13);
        uVar7 = 0;
        if (pIVar13->has_result_id_ == true) {
          uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
        }
        local_158._M_buckets = (__buckets_ptr)CONCAT44(local_158._M_buckets._4_4_,uVar7);
        local_120.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
             (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
             (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)&local_a0;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_a0,&local_158,&local_120);
      }
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  pLVar5 = local_160;
  sim_result->used_registers_ = 0;
  local_158._M_buckets = &((sim_result->live_in_)._M_h._M_before_begin._M_nxt)->_M_nxt;
  local_d8._M_buckets = (__buckets_ptr)0x0;
  predicate.l2 = in_R9;
  predicate.l1 = local_160;
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&local_120,(opt *)&local_158,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_d8,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)l1,predicate);
  predicate_00.l2 = in_R9;
  predicate_00.l1 = pLVar5;
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&local_100,(opt *)&local_d8,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_d8,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)l1,predicate_00);
  for (p_Var14 = (l1->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
      p_Var14 != (_Hash_node_base *)0x0; p_Var14 = p_Var14->_M_nxt) {
    uVar7 = *(uint32_t *)&p_Var14[1]._M_nxt;
    pIVar2 = this->context_;
    if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar2);
    }
    local_158._M_buckets = (__buckets_ptr)CONCAT44(local_158._M_buckets._4_4_,uVar7);
    ppBVar11 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&((pIVar2->cfg_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                         .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                        id2block_,(key_type *)&local_158);
    pBVar3 = *ppBVar11;
    pRVar9 = Get(this,uVar7);
    if (pRVar9 == (RegionRegisterLiveness *)0x0) {
      __assert_fail("live_inout_info != nullptr && \"Basic block not processed\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                    ,0x18c,
                    "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                   );
    }
    local_158._M_buckets = (__buckets_ptr)0x0;
    local_158._M_bucket_count = (pRVar9->live_out_)._M_h._M_bucket_count;
    local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_158._M_element_count = (pRVar9->live_out_)._M_h._M_element_count;
    local_158._M_rehash_policy._M_max_load_factor =
         (pRVar9->live_out_)._M_h._M_rehash_policy._M_max_load_factor;
    local_158._M_rehash_policy._4_4_ =
         *(undefined4 *)&(pRVar9->live_out_)._M_h._M_rehash_policy.field_0x4;
    local_158._M_rehash_policy._M_next_resize =
         (pRVar9->live_out_)._M_h._M_rehash_policy._M_next_resize;
    local_158._M_single_bucket = (__node_base_ptr)0x0;
    local_d8._M_buckets = (__buckets_ptr)&local_158;
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_158,&(pRVar9->live_out_)._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction_*,_false>_>_>
                *)&local_d8);
    __first.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_120.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_120.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first.predicate_.l1 = local_120.predicate_.l1;
    __first.predicate_.l2 = local_120.predicate_.l2;
    __last.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_100.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_100.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last.predicate_.l1 = local_100.predicate_.l1;
    __last.predicate_.l2 = local_100.predicate_.l2;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)&local_158,__first,__last);
    uVar12 = (local_158._M_element_count + pRVar9->used_registers_) -
             (pRVar9->live_out_)._M_h._M_element_count;
    if (uVar12 < sim_result->used_registers_) {
      uVar12 = sim_result->used_registers_;
    }
    sim_result->used_registers_ = uVar12;
    for (pIVar13 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        pIVar13 != &(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      OVar1 = pIVar13->opcode_;
      if ((((OVar1 != OpPhi) && (OVar1 != OpUndef)) && (pIVar13->has_result_id_ != false)) &&
         ((iVar8 = spvOpcodeIsConstant(OVar1), iVar8 == 0 && (pIVar13->opcode_ != OpLabel)))) {
        uVar7 = 0;
        if (pIVar13->has_result_id_ == true) {
          uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
        }
        local_d8._M_buckets = (__buckets_ptr)CONCAT44(local_d8._M_buckets._4_4_,uVar7);
        sVar10 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&local_a0,(key_type *)&local_d8);
        if (sVar10 == 0) {
          RegionRegisterLiveness::AddRegisterClass(sim_result,pIVar13);
        }
      }
    }
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_158);
  }
  pIVar13 = (l1->loop_latch_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar7 = 0;
  if (pIVar13->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  pRVar9 = Get(this,uVar7);
  if (pRVar9 != (RegionRegisterLiveness *)0x0) {
    local_158._M_buckets = (__buckets_ptr)0x0;
    local_158._M_bucket_count = (pRVar9->live_out_)._M_h._M_bucket_count;
    local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_158._M_element_count = (pRVar9->live_out_)._M_h._M_element_count;
    local_158._M_rehash_policy._M_max_load_factor =
         (pRVar9->live_out_)._M_h._M_rehash_policy._M_max_load_factor;
    local_158._M_rehash_policy._4_4_ =
         *(undefined4 *)&(pRVar9->live_out_)._M_h._M_rehash_policy.field_0x4;
    local_158._M_rehash_policy._M_next_resize =
         (pRVar9->live_out_)._M_h._M_rehash_policy._M_next_resize;
    local_158._M_single_bucket = (__node_base_ptr)0x0;
    local_d8._M_buckets = (__buckets_ptr)&local_158;
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_158,&(pRVar9->live_out_)._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction_*,_false>_>_>
                *)&local_d8);
    __first_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_120.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_120.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_00.predicate_.l1 = local_120.predicate_.l1;
    __first_00.predicate_.l2 = local_120.predicate_.l2;
    __last_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_100.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_100.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_00.predicate_.l1 = local_100.predicate_.l1;
    __last_00.predicate_.l2 = local_100.predicate_.l2;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)&local_158,__first_00,__last_00);
    _Var6._M_nxt = local_158._M_before_begin._M_nxt;
    p_Var14 = (local_160->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
    if (p_Var14 != (_Hash_node_base *)0x0) {
      local_e0 = sim_result;
      do {
        uVar7 = *(uint32_t *)&p_Var14[1]._M_nxt;
        pIVar2 = this->context_;
        if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(pIVar2);
        }
        local_d8._M_buckets = (__buckets_ptr)CONCAT44(local_d8._M_buckets._4_4_,uVar7);
        ppBVar11 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&((pIVar2->cfg_)._M_t.
                             super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                             .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                            id2block_,(key_type *)&local_d8);
        pBVar3 = *ppBVar11;
        pRVar9 = Get(this,uVar7);
        if (pRVar9 == (RegionRegisterLiveness *)0x0) {
          __assert_fail("live_inout_info != nullptr && \"Basic block not processed\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                        ,0x1ab,
                        "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                       );
        }
        local_d8._M_buckets = (__buckets_ptr)0x0;
        local_d8._M_bucket_count = (pRVar9->live_out_)._M_h._M_bucket_count;
        local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_d8._M_element_count = (pRVar9->live_out_)._M_h._M_element_count;
        local_d8._M_rehash_policy._M_max_load_factor =
             (pRVar9->live_out_)._M_h._M_rehash_policy._M_max_load_factor;
        local_d8._M_rehash_policy._4_4_ =
             *(undefined4 *)&(pRVar9->live_out_)._M_h._M_rehash_policy.field_0x4;
        local_d8._M_rehash_policy._M_next_resize =
             (pRVar9->live_out_)._M_h._M_rehash_policy._M_next_resize;
        local_d8._M_single_bucket = (__node_base_ptr)0x0;
        local_168._M_h = (__hashtable_alloc *)&local_d8;
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_d8,&(pRVar9->live_out_)._M_h,&local_168);
        local_168._M_h = (__hashtable_alloc *)&local_d8;
        this_00 = local_e0;
        for (_Var4._M_nxt = _Var6._M_nxt; local_e0 = this_00, _Var4._M_nxt != (_Hash_node_base *)0x0
            ; _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
          std::
          _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                    ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_d8,_Var4._M_nxt + 1,&local_168);
          this_00 = local_e0;
        }
        uVar12 = (local_d8._M_element_count + pRVar9->used_registers_) -
                 (pRVar9->live_out_)._M_h._M_element_count;
        if (uVar12 < this_00->used_registers_) {
          uVar12 = this_00->used_registers_;
        }
        this_00->used_registers_ = uVar12;
        for (pIVar13 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                       super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
            pIVar13 != &(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
            pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
          OVar1 = pIVar13->opcode_;
          if (((OVar1 != OpPhi) && (OVar1 != OpUndef)) &&
             ((pIVar13->has_result_id_ != false &&
              ((iVar8 = spvOpcodeIsConstant(OVar1), iVar8 == 0 && (pIVar13->opcode_ != OpLabel))))))
          {
            uVar7 = 0;
            if (pIVar13->has_result_id_ == true) {
              uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
            }
            local_168._M_h._0_4_ = uVar7;
            sVar10 = std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&local_a0,(key_type *)&local_168);
            if (sVar10 == 0) {
              RegionRegisterLiveness::AddRegisterClass(this_00,pIVar13);
            }
          }
        }
        std::
        _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_d8);
        p_Var14 = p_Var14->_M_nxt;
      } while (p_Var14 != (_Hash_node_base *)0x0);
    }
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_158);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_a0);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
    return;
  }
  __assert_fail("l1_latch_live_inout_info != nullptr && \"Basic block not processed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0x19f,
                "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
               );
}

Assistant:

void RegisterLiveness::SimulateFusion(
    const Loop& l1, const Loop& l2, RegionRegisterLiveness* sim_result) const {
  sim_result->Clear();

  // Compute the live-in state:
  //   sim_result.live_in = l1.live_in U l2.live_in
  // This assumes that |l1| does not generated register that is live-out for
  // |l1|.
  const RegionRegisterLiveness* l1_header_live_inout = Get(l1.GetHeaderBlock());
  sim_result->live_in_ = l1_header_live_inout->live_in_;

  const RegionRegisterLiveness* l2_header_live_inout = Get(l2.GetHeaderBlock());
  sim_result->live_in_.insert(l2_header_live_inout->live_in_.begin(),
                              l2_header_live_inout->live_in_.end());

  // The live-out set of the fused loop is the l2 live-out set.
  std::unordered_set<uint32_t> exit_blocks;
  l2.GetExitBlocks(&exit_blocks);

  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    sim_result->live_out_.insert(live_inout->live_in_.begin(),
                                 live_inout->live_in_.end());
  }

  // Compute the register usage information.
  std::unordered_set<uint32_t> seen_insn;
  for (Instruction* insn : sim_result->live_out_) {
    sim_result->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }
  for (Instruction* insn : sim_result->live_in_) {
    if (!seen_insn.count(insn->result_id())) {
      continue;
    }
    sim_result->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }

  sim_result->used_registers_ = 0;

  // The loop fusion is injecting the l1 before the l2, the latch of l1 will be
  // connected to the header of l2.
  // To compute the register usage, we inject the loop live-in (union of l1 and
  // l2 live-in header blocks) into the live in/out of each basic block of
  // l1 to get the peak register usage. We then repeat the operation to for l2
  // basic blocks but in this case we inject the live-out of the latch of l1.
  auto live_loop = MakeFilterIteratorRange(
      sim_result->live_in_.begin(), sim_result->live_in_.end(),
      [&l1, &l2](Instruction* insn) {
        BasicBlock* bb = insn->context()->get_instr_block(insn);
        return insn->HasResultId() &&
               !(insn->opcode() == spv::Op::OpPhi &&
                 (bb == l1.GetHeaderBlock() || bb == l2.GetHeaderBlock()));
      });

  for (uint32_t bb_id : l1.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout_info = Get(bb_id);
    assert(live_inout_info != nullptr && "Basic block not processed");
    RegionRegisterLiveness::LiveSet live_out = live_inout_info->live_out_;
    live_out.insert(live_loop.begin(), live_loop.end());
    sim_result->used_registers_ =
        std::max(sim_result->used_registers_,
                 live_inout_info->used_registers_ + live_out.size() -
                     live_inout_info->live_out_.size());

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      sim_result->AddRegisterClass(&insn);
    }
  }

  const RegionRegisterLiveness* l1_latch_live_inout_info =
      Get(l1.GetLatchBlock()->id());
  assert(l1_latch_live_inout_info != nullptr && "Basic block not processed");
  RegionRegisterLiveness::LiveSet l1_latch_live_out =
      l1_latch_live_inout_info->live_out_;
  l1_latch_live_out.insert(live_loop.begin(), live_loop.end());

  auto live_loop_l2 =
      make_range(l1_latch_live_out.begin(), l1_latch_live_out.end());

  for (uint32_t bb_id : l2.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout_info = Get(bb_id);
    assert(live_inout_info != nullptr && "Basic block not processed");
    RegionRegisterLiveness::LiveSet live_out = live_inout_info->live_out_;
    live_out.insert(live_loop_l2.begin(), live_loop_l2.end());
    sim_result->used_registers_ =
        std::max(sim_result->used_registers_,
                 live_inout_info->used_registers_ + live_out.size() -
                     live_inout_info->live_out_.size());

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      sim_result->AddRegisterClass(&insn);
    }
  }
}